

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_posix_file_impl.h
# Opt level: O0

exr_result_t finalize_write(exr_context_t pf,int failed)

{
  code *pcVar1;
  int iVar2;
  char *pcVar3;
  int in_ESI;
  long in_RDI;
  int mvret;
  exr_result_t rv;
  exr_result_t local_4;
  
  if ((in_ESI != 0) && (*(code **)(in_RDI + 0x90) == default_shutdown)) {
    if (*(long *)(in_RDI + 0x20) == 0) {
      unlink(*(char **)(in_RDI + 0x10));
    }
    else {
      unlink(*(char **)(in_RDI + 0x20));
    }
  }
  if (((in_ESI == 0) && (*(long *)(in_RDI + 0x20) != 0)) &&
     (iVar2 = rename(*(char **)(in_RDI + 0x20),*(char **)(in_RDI + 0x10)), iVar2 < 0)) {
    pcVar1 = *(code **)(in_RDI + 0x48);
    pcVar3 = strerror(0);
    local_4 = (*pcVar1)(in_RDI,5,"Unable to rename temporary file: %s",pcVar3);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static exr_result_t
finalize_write (exr_context_t pf, int failed)
{
    exr_result_t rv = EXR_ERR_SUCCESS;

    /* TODO: Do we actually want to do this or leave the garbage file there */
    if (failed && pf->destroy_fn == &default_shutdown)
    {
        if (pf->tmp_filename.str)
            unlink (pf->tmp_filename.str);
        else
            unlink (pf->filename.str);
    }

    if (!failed && pf->tmp_filename.str)
    {
        int mvret = rename (pf->tmp_filename.str, pf->filename.str);
        if (mvret < 0)
            return pf->print_error (
                pf,
                EXR_ERR_FILE_ACCESS,
                "Unable to rename temporary file: %s",
                strerror (rv));
    }

    return rv;
}